

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::GlobalsScopeVariablesGroupDisplay::GlobalsScopeVariablesGroupDisplay
          (GlobalsScopeVariablesGroupDisplay *this,VariableWalkerBase *walker,
          ResolvedObject *resolvedObject)

{
  Var pvVar1;
  Var pvVar2;
  
  (this->super_RecyclableObjectDisplay).scriptContext = resolvedObject->scriptContext;
  pvVar1 = resolvedObject->obj;
  (this->super_RecyclableObjectDisplay).instance = pvVar1;
  pvVar2 = resolvedObject->originalObj;
  if (resolvedObject->originalObj == (Var)0x0) {
    pvVar2 = pvVar1;
  }
  (this->super_RecyclableObjectDisplay).originalInstance = pvVar2;
  (this->super_RecyclableObjectDisplay).name = resolvedObject->name;
  (this->super_RecyclableObjectDisplay).pObjAddress = resolvedObject->address;
  (this->super_RecyclableObjectDisplay).defaultAttributes = 0;
  (this->super_RecyclableObjectDisplay).propertyId = resolvedObject->propId;
  (this->super_RecyclableObjectDisplay).super_IDiagObjectModelDisplay._vptr_IDiagObjectModelDisplay
       = (_func_int **)&PTR_Name_014e2cc8;
  this->globalsGroupWalker = walker;
  return;
}

Assistant:

GlobalsScopeVariablesGroupDisplay::GlobalsScopeVariablesGroupDisplay(VariableWalkerBase *walker, ResolvedObject* resolvedObject)
        : globalsGroupWalker(walker),
          RecyclableObjectDisplay(resolvedObject)
    {
    }